

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_format_duration.cpp
# Opt level: O0

void __thiscall milliseconds::test_method(milliseconds *this)

{
  bool bVar1;
  duration *in_stack_00000068;
  char *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffdc0;
  duration<long,_std::ratio<1L,_1000000000L>_> *pdVar2;
  int local_1c4;
  duration<long,std::ratio<1l,1000000l>> local_1c0 [16];
  string local_1b0 [32];
  basic_cstring<const_char> local_190;
  undefined1 local_180 [40];
  undefined1 local_158 [16];
  basic_cstring<const_char> local_148;
  int local_134;
  duration<long,std::ratio<1l,1000000l>> local_130 [16];
  string local_120 [32];
  basic_cstring<const_char> local_100;
  undefined1 local_f0 [40];
  undefined1 local_c8 [16];
  basic_cstring<const_char> local_b8;
  int local_a4;
  duration<long,std::ratio<1l,1000l>> local_a0 [16];
  string local_90 [48];
  basic_cstring<const_char> local_60;
  undefined1 local_50 [40];
  undefined1 local_28 [16];
  basic_cstring<const_char> local_18;
  
  do {
    pdVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/test/test_format_duration.cpp"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdb0);
    boost::unit_test::unit_test_log_t::set_checkpoint(pdVar2,&local_18,0x1d,local_28);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffdb8,(char (*) [1])in_stack_fffffffffffffdb0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/test/test_format_duration.cpp"
               ,0x69);
    local_a4 = 1;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_a0,&local_a4);
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1000l>,void>
              (in_stack_fffffffffffffdc0,
               (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffdb8);
    perf::format_duration_abi_cxx11_(in_stack_00000068);
    in_stack_fffffffffffffdb8 = "\"1 ms\"";
    in_stack_fffffffffffffdb0 = "1 ms";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_50,&local_60,0x1d,1,2,local_90,"perf::format_duration(perf::milliseconds(1))");
    std::__cxx11::string::~string(local_90);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x10740b);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    pdVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/test/test_format_duration.cpp"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdb0);
    boost::unit_test::unit_test_log_t::set_checkpoint(pdVar2,&local_b8,0x1e,local_c8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffdb8,(char (*) [1])in_stack_fffffffffffffdb0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_100,
               "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/test/test_format_duration.cpp"
               ,0x69);
    local_134 = 1000;
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>(local_130,&local_134);
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::
    duration<long,std::ratio<1l,1000000l>,void>
              (in_stack_fffffffffffffdc0,
               (duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffffdb8);
    perf::format_duration_abi_cxx11_(in_stack_00000068);
    in_stack_fffffffffffffdb8 = "\"1 ms\"";
    in_stack_fffffffffffffdb0 = "1 ms";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_f0,&local_100,0x1e,1,2,local_120,
               "perf::format_duration(perf::microseconds(1000))");
    std::__cxx11::string::~string(local_120);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x10756a);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    pdVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_148,
               "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/test/test_format_duration.cpp"
               ,0x69);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdb0);
    boost::unit_test::unit_test_log_t::set_checkpoint(pdVar2,&local_148,0x1f,local_158);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffdb8,(char (*) [1])in_stack_fffffffffffffdb0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_190,
               "/workspace/llm4binary/github/license_all_cmakelists_25/f-koehler[P]cpp-perf/test/test_format_duration.cpp"
               ,0x69);
    local_1c4 = 2000;
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>(local_1c0,&local_1c4);
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::
    duration<long,std::ratio<1l,1000000l>,void>
              (pdVar2,(duration<long,_std::ratio<1L,_1000000L>_> *)in_stack_fffffffffffffdb8);
    perf::format_duration_abi_cxx11_(in_stack_00000068);
    in_stack_fffffffffffffdb8 = "\"2 ms\"";
    in_stack_fffffffffffffdb0 = "2 ms";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_180,&local_190,0x1f,1,2,local_1b0,
               "perf::format_duration(perf::microseconds(2000))");
    std::__cxx11::string::~string(local_1b0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1076c9);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(milliseconds)
{
    BOOST_CHECK_EQUAL(perf::format_duration(perf::milliseconds(1)), "1 ms");
    BOOST_CHECK_EQUAL(perf::format_duration(perf::microseconds(1000)), "1 ms");
    BOOST_CHECK_EQUAL(perf::format_duration(perf::microseconds(2000)), "2 ms");
}